

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fssimplewindow.cpp
# Opt level: O2

int FsStringToKeyCode(char *str)

{
  char cVar1;
  int iVar2;
  long lVar3;
  int i;
  char **ppcVar4;
  char upper [256];
  char local_128 [264];
  
  if (str != (char *)0x0) {
    for (lVar3 = 0; (lVar3 != 0xff && (cVar1 = str[lVar3], cVar1 != '\0')); lVar3 = lVar3 + 1) {
      local_128[lVar3] = cVar1;
      local_128[lVar3 + 1] = '\0';
      if ((byte)(cVar1 + 0x9fU) < 0x1a) {
        local_128[lVar3] = cVar1 + -0x20;
      }
    }
    ppcVar4 = keyCodeToStr;
    for (lVar3 = 0; lVar3 != 0x65; lVar3 = lVar3 + 1) {
      iVar2 = strcmp(local_128,*ppcVar4);
      if (iVar2 == 0) {
        return (int)lVar3;
      }
      ppcVar4 = ppcVar4 + 1;
    }
  }
  return 0;
}

Assistant:

int FsStringToKeyCode(const char str[])
{
	if(nullptr==str)
	{
		return FSKEY_NULL;
	}

	char upper[256];
	for(int i=0; i<255 && 0!=str[i]; ++i)
	{
		upper[i  ]=str[i];
		upper[i+1]=0;
		if('a'<=upper[i] && upper[i]<='z')
		{
			upper[i]=upper[i]+'A'-'a';
		}
	}
	for(int i=0; i<FSKEY_NUM_KEYCODE; ++i)
	{
		if(0==strcmp(upper,keyCodeToStr[i]))
		{
			return i;
		}
	}
	return FSKEY_NULL;
}